

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregularexpression.cpp
# Opt level: O2

qsizetype __thiscall QRegularExpressionMatch::capturedLength(QRegularExpressionMatch *this,int nth)

{
  qsizetype qVar1;
  qsizetype qVar2;
  
  qVar1 = capturedEnd(this,nth);
  qVar2 = capturedStart(this,nth);
  return qVar1 - qVar2;
}

Assistant:

qsizetype QRegularExpressionMatch::capturedLength(int nth) const
{
    // bound checking performed by these two functions
    return capturedEnd(nth) - capturedStart(nth);
}